

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageAtomicOpCase::iterate(ImageAtomicOpCase *this)

{
  size_type *psVar1;
  uint uVar2;
  RenderContext *renderCtx;
  bool bVar3;
  ContextType CVar4;
  GLSLVersion version;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  GLenum GVar8;
  char *pcVar9;
  ostream *poVar10;
  undefined4 extraout_var;
  ProgramSources *sources;
  ulong uVar11;
  TestError *pTVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  pointer puVar16;
  int iVar17;
  ulong uVar18;
  allocator<char> local_4e5;
  int local_4e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  BufferMemMap bufMap;
  Texture outputTexture;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels;
  Buffer inputBuffer;
  Framebuffer fbo;
  InterfaceBlockInfo blockInfo;
  Random rnd;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  Functions *gl;
  
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(CVar4);
  CVar4.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar9 = glu::getGLSLVersionDeclaration(version);
  poVar10 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar9);
  poVar10 = std::operator<<(poVar10,"\n");
  pcVar9 = "#extension GL_OES_shader_image_atomic : require\n";
  if (bVar3) {
    pcVar9 = "\n";
  }
  poVar10 = std::operator<<(poVar10,pcVar9);
  poVar10 = std::operator<<(poVar10,"layout (local_size_x = ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_localSize);
  poVar10 = std::operator<<(poVar10,") in;\n");
  poVar10 = std::operator<<(poVar10,"layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n")
  ;
  poVar10 = std::operator<<(poVar10,"buffer Input {\n");
  poVar10 = std::operator<<(poVar10,"    uint values[");
  poVar10 = (ostream *)
            std::ostream::operator<<
                      (poVar10,(this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0] *
                               this->m_localSize);
  poVar10 = std::operator<<(poVar10,"];\n");
  poVar10 = std::operator<<(poVar10,"} sb_in;\n\n");
  poVar10 = std::operator<<(poVar10,"void main (void) {\n");
  poVar10 = std::operator<<(poVar10,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar10 = std::operator<<(poVar10,
                            "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                           );
  poVar10 = std::operator<<(poVar10,"\n");
  poVar10 = std::operator<<(poVar10,"    if (gl_LocalInvocationIndex == 0u)\n");
  poVar10 = std::operator<<(poVar10,
                            "        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n");
  poVar10 = std::operator<<(poVar10,"    barrier();\n");
  poVar10 = std::operator<<(poVar10,
                            "    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n");
  std::operator<<(poVar10,"}\n");
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar5);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            (&outputTexture,((this->super_TestCase).m_context)->m_renderCtx);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  psVar1 = &blockInfo.name._M_string_length;
  blockInfo.name._M_dataplus._M_p._0_4_ = 5;
  std::__cxx11::string::string((string *)psVar1,(string *)&bufMap);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)&blockInfo)
  ;
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)psVar1);
  std::__cxx11::string::~string((string *)&bufMap);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  deRandom_init(&rnd.m_rnd,0x77238ac2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inputValues,
             (long)((this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0] *
                   this->m_localSize),(allocator_type *)&valueInfo);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x500);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar1 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"Work groups: ");
  tcu::operator<<((ostream *)psVar1,&this->m_imageSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  (*gl->useProgram)(program.m_program.m_program);
  for (puVar16 = inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
      puVar16 !=
      inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar16 = puVar16 + 1) {
    dVar6 = deRandom_getUint32(&rnd.m_rnd);
    *puVar16 = dVar6;
  }
  GVar7 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Input");
  glu::getProgramInterfaceBlockInfo(&blockInfo,gl,program.m_program.m_program,0x92e6,GVar7);
  GVar7 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Input.values");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program.m_program.m_program,0x92e5,GVar7);
  (*gl->bindBuffer)(0x90d2,inputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)blockInfo.dataSize,(void *)0x0,0x88e4);
  if (valueInfo.arraySize ==
      (deUint32)
      ((ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,blockInfo.dataSize,2);
    for (uVar13 = 0;
        ((ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) != uVar13;
        uVar13 = uVar13 + 1) {
      *(uint *)((long)bufMap.m_ptr +
               (ulong)(uint)(valueInfo.arrayStride * (int)uVar13) + (ulong)valueInfo.offset) =
           inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13];
    }
    BufferMemMap::~BufferMemMap(&bufMap);
    (*gl->bindBufferBase)(0x90d2,blockInfo.bufferBinding,inputBuffer.super_ObjectWrapper.m_object);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Input buffer setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x51e);
    std::__cxx11::string::~string((string *)&valueInfo);
    glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
    (*gl->bindTexture)(0xde1,outputTexture.super_ObjectWrapper.m_object);
    (*gl->texStorage2D)(0xde1,1,0x8236,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1]);
    (*gl->texParameteri)(0xde1,0x2801,0x2600);
    (*gl->texParameteri)(0xde1,0x2800,0x2600);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Uploading image data failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x526);
    (*gl->bindImageTexture)(1,outputTexture.super_ObjectWrapper.m_object,0,'\0',0,0x88ba,0x8236);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"Image setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x52a);
    (*gl->dispatchCompute)((this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1],1);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"glDispatchCompute()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                    ,0x52e);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (&fbo,((this->super_TestCase).m_context)->m_renderCtx);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&pixels,(long)((this->m_imageSize).m_data[0] * (this->m_imageSize).m_data[1] * 4),
               (allocator_type *)&valueInfo);
    (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
    (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,outputTexture.super_ObjectWrapper.m_object,0);
    GVar8 = (*gl->checkFramebufferStatus)(0x8d40);
    if (GVar8 == 0x8cd5) {
      (*gl->readBuffer)(0x8ce0);
      (*gl->readPixels)(0,0,(this->m_imageSize).m_data[0],(this->m_imageSize).m_data[1],0x8d99,
                        0x1405,pixels.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x53c);
      uVar13 = (ulong)((long)inputValues.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)inputValues.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
      uVar2 = this->m_localSize;
      uVar13 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
               (long)(int)uVar2;
      uVar11 = uVar13 & 0xffffffff;
      iVar5 = 0;
      uVar14 = 0;
      if (0 < (int)uVar2) {
        uVar14 = (ulong)uVar2;
      }
      if ((int)uVar13 < 1) {
        uVar11 = 0;
      }
      uVar13 = 0;
      do {
        local_4e4 = (int)uVar13;
        if (uVar13 == uVar11) {
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          glu::ShaderProgram::~ShaderProgram(&program);
          glu::ObjectWrapper::~ObjectWrapper(&outputTexture.super_ObjectWrapper);
          glu::ObjectWrapper::~ObjectWrapper(&inputBuffer.super_ObjectWrapper);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
          return STOP;
        }
        uVar15 = 0;
        uVar18 = uVar14;
        iVar17 = iVar5;
        while (bVar3 = uVar18 != 0, uVar18 = uVar18 - 1, bVar3) {
          uVar15 = uVar15 + inputValues.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar17];
          iVar17 = iVar17 + 1;
        }
        uVar13 = uVar13 + 1;
        iVar5 = iVar5 + uVar2;
      } while (pixels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[local_4e4 * 4] == uVar15);
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockInfo,"Comparison failed for pixel ",&local_4e5);
      de::toString<int>((string *)&bufMap,&local_4e4);
      std::operator+(&valueInfo.name,&blockInfo.name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap);
      tcu::TestError::TestError(pTVar12,&valueInfo.name);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x537);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x514);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< (supportsES32 ? "\n" : "#extension GL_OES_shader_image_atomic : require\n")
			<< "layout (local_size_x = " << m_localSize << ") in;\n"
			<< "layout(r32ui, binding = 1) uniform highp uimage2D u_dstImg;\n"
			<< "buffer Input {\n"
			<< "    uint values[" << (m_imageSize[0]*m_imageSize[1]*m_localSize) << "];\n"
			<< "} sb_in;\n\n"
			<< "void main (void) {\n"
			<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
			<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
			<< "\n"
			<< "    if (gl_LocalInvocationIndex == 0u)\n"
			<< "        imageStore(u_dstImg, ivec2(gl_WorkGroupID.xy), uvec4(0));\n"
			<< "    barrier();\n"
			<< "    imageAtomicAdd(u_dstImg, ivec2(gl_WorkGroupID.xy), value);\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Texture				outputTexture	(m_context.getRenderContext());
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		de::Random					rnd				(0x77238ac2);
		vector<deUint32>			inputValues		(m_imageSize[0]*m_imageSize[1]*m_localSize);

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_imageSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input values
		for (vector<deUint32>::iterator i = inputValues.begin(); i != inputValues.end(); ++i)
			*i = rnd.getUint32();

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output image setup
		gl.bindTexture(GL_TEXTURE_2D, *outputTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_imageSize[0], m_imageSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 1
		gl.bindImageTexture(1, *outputTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Dispatch compute workload
		gl.dispatchCompute(m_imageSize[0], m_imageSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			Framebuffer			fbo			(m_context.getRenderContext());
			vector<deUint32>	pixels		(m_imageSize[0]*m_imageSize[1]*4);

			gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
			gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *outputTexture, 0);
			TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

			// \note In ES3 we have to use GL_RGBA_INTEGER
			gl.readBuffer(GL_COLOR_ATTACHMENT0);
			gl.readPixels(0, 0, m_imageSize[0], m_imageSize[1], GL_RGBA_INTEGER, GL_UNSIGNED_INT, &pixels[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			for (int pixelNdx = 0; pixelNdx < (int)inputValues.size()/m_localSize; pixelNdx++)
			{
				const deUint32	res		= pixels[pixelNdx*4];
				deUint32		ref		= 0;

				for (int offs = 0; offs < m_localSize; offs++)
					ref += inputValues[pixelNdx*m_localSize + offs];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for pixel ") + de::toString(pixelNdx));
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}